

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::line_style
          (Fl_PostScript_Graphics_Driver *this,int style,int width,char *dashes)

{
  int *local_40;
  int *ds;
  double *dt;
  uint local_28;
  int join;
  int cap;
  char width0;
  char *dashes_local;
  int width_local;
  int style_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  this->linewidth_ = width;
  this->linestyle_ = style;
  if (dashes == (char *)0x0) {
    this->linedash_[0] = '\0';
  }
  else if (dashes != this->linedash_) {
    strcpy(this->linedash_,dashes);
  }
  dashes_local._0_4_ = width;
  if (width == 0) {
    dashes_local._0_4_ = 1;
  }
  fprintf((FILE *)this->output,"%i setlinewidth\n",(ulong)(uint)dashes_local);
  dashes_local._4_4_ = style;
  if ((style == 0) && (((dashes == (char *)0x0 || (*dashes == '\0')) && (width == 0)))) {
    dashes_local._4_4_ = 0x300;
  }
  local_28 = (int)(dashes_local._4_4_ & 0xf00) >> 8;
  if (local_28 != 0) {
    local_28 = local_28 - 1;
  }
  fprintf((FILE *)this->output,"%i setlinecap\n",(ulong)local_28);
  dt._4_4_ = (int)(dashes_local._4_4_ & 0xf000) >> 0xc;
  if (dt._4_4_ != 0) {
    dt._4_4_ = dt._4_4_ - 1;
  }
  fprintf((FILE *)this->output,"%i setlinejoin\n",(ulong)dt._4_4_);
  fprintf((FILE *)this->output,"[");
  if ((dashes == (char *)0x0) || (_cap = dashes, *dashes == '\0')) {
    if ((dashes_local._4_4_ & 0x200) == 0) {
      for (local_40 = dashes_flat[(int)(dashes_local._4_4_ & 0xff)]; -1 < *local_40;
          local_40 = local_40 + 1) {
        fprintf((FILE *)this->output,"%i ",(ulong)((uint)dashes_local * *local_40));
      }
    }
    else {
      for (ds = (int *)(dashes_cap + (int)(dashes_local._4_4_ & 0xff)); 0.0 <= *(double *)ds;
          ds = ds + 2) {
        clocale_printf(this,"%g ",(double)(int)(uint)dashes_local * *(double *)ds);
      }
    }
  }
  else {
    for (; *_cap != '\0'; _cap = _cap + 1) {
      fprintf((FILE *)this->output,"%i ",(ulong)(uint)(int)*_cap);
    }
  }
  fprintf((FILE *)this->output,"] 0 setdash\n");
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::line_style(int style, int width, char* dashes){
  //line_styled_=1;
  
  linewidth_=width;
  linestyle_=style;
  //dashes_= dashes;
  if(dashes){
    if(dashes != linedash_)
      strcpy(linedash_,dashes);
    
  }else
    linedash_[0]=0;
  char width0 = 0;
  if(!width){
    width=1; //for screen drawing compatibility
    width0=1;
  }
  
  fprintf(output, "%i setlinewidth\n", width);
  
  if(!style && (!dashes || !(*dashes)) && width0) //system lines
    style = FL_CAP_SQUARE;
  
  int cap = (style &0xf00) >> 8;
  if(cap) cap--;
  fprintf(output,"%i setlinecap\n", cap);
  
  int join = (style & 0xf000) >> 12;
  
  if(join) join--;
  fprintf(output,"%i setlinejoin\n", join);
  
  
  fprintf(output, "[");
  if(dashes && *dashes){
    while(*dashes){
      fprintf(output, "%i ", *dashes);
      dashes++;
    }
  }else{
    if(style & 0x200){ // round and square caps, dash length need to be adjusted
      const double *dt = dashes_cap[style & 0xff];
      while (*dt >= 0){
        clocale_printf("%g ",width * (*dt));
        dt++;
      }
    }else{
      
      const int *ds = dashes_flat[style & 0xff];
      while (*ds >= 0){
	fprintf(output, "%i ",width * (*ds));
        ds++;
      }
    }
  }
  fprintf(output, "] 0 setdash\n");
}